

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

string * __thiscall filesystem::path::stem_abi_cxx11_(string *__return_storage_ptr__,path *this)

{
  allocator local_31;
  string name;
  
  filename_abi_cxx11_(&name,this);
  if (name._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  }
  else {
    std::__cxx11::string::find_last_of((char *)&name,0x10758c);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&name);
  }
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string stem() const {
        std::string name = filename();
        if (name.empty())
            return "";
        return name.substr(0, name.find_last_of("."));
    }